

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void MOJOSHADER_runPreshader(MOJOSHADER_preshader *preshader,float *outregs)

{
  uint *puVar1;
  double dVar2;
  uint uVar3;
  float *pfVar4;
  double *pdVar5;
  long lVar6;
  double (*padVar7) [4];
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  ulong uVar12;
  size_t sVar13;
  double *pdVar14;
  undefined1 *__s;
  MOJOSHADER_preshaderInstruction *pMVar15;
  MOJOSHADER_preshaderOpcode MVar16;
  MOJOSHADER_preshaderOperand *pMVar17;
  int *regsi;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  undefined8 uStack_110;
  undefined1 auStack_108 [8];
  ulong local_100;
  size_t local_f8;
  undefined8 uStack_f0;
  MOJOSHADER_preshaderInstruction *local_e8;
  double local_e0;
  double dStack_d8;
  double src [3] [4];
  undefined1 *local_70;
  double dStack_58;
  double dst [4];
  
  __s = auStack_108;
  pfVar4 = preshader->registers;
  uVar18 = (ulong)preshader->temp_count;
  if (uVar18 == 0) {
    local_70 = (undefined1 *)0x0;
  }
  else {
    lVar6 = -(uVar18 * 8 + 0xf & 0xfffffffffffffff0);
    __s = auStack_108 + lVar6;
    *(undefined8 *)((long)&uStack_110 + lVar6) = 0x126868;
    memset(__s,0,uVar18 << 3);
    local_70 = __s;
  }
  dst[1] = 0.0;
  dst[2] = 0.0;
  dStack_58 = 0.0;
  dst[0] = 0.0;
  src[2][1] = 0.0;
  src[2][2] = 0.0;
  src[1][3] = 0.0;
  src[2][0] = 0.0;
  src[1][1] = 0.0;
  src[1][2] = 0.0;
  src[0][3] = 0.0;
  src[1][0] = 0.0;
  src[0][1] = 0.0;
  src[0][2] = 0.0;
  dStack_d8 = 0.0;
  src[0][0] = 0.0;
  if (preshader->instruction_count != 0) {
    pMVar15 = preshader->instructions;
    uVar18 = 0;
    do {
      uVar8 = pMVar15->element_count;
      uVar12 = (ulong)uVar8;
      if ((int)uVar8 < 0) {
        *(undefined8 *)(__s + -8) = 0x12743e;
        __assert_fail("elems >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x31,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      if (4 < (int)uVar8) {
        *(undefined8 *)(__s + -8) = 0x12741f;
        __assert_fail("elems <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x32,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      }
      uStack_f0._4_4_ = uVar8 * 8;
      pMVar17 = pMVar15->operands;
      local_100 = uVar18;
      local_e8 = pMVar15;
      if (pMVar15->operand_count != 1) {
        MVar16 = pMVar15->opcode;
        local_f8 = (size_t)uStack_f0._4_4_;
        pdVar14 = &dStack_d8;
        uVar18 = 0;
        local_e0 = (double)CONCAT44(local_e0._4_4_,MVar16);
        do {
          sVar13 = local_f8;
          bVar19 = MVar16 < MOJOSHADER_PRESHADEROP_MIN_SCALAR;
          bVar20 = uVar18 != 0;
          if (MOJOSHADER_PRESHADEROPERAND_TEMP < pMVar17->type) {
            *(undefined8 *)(__s + -8) = 0x1273e1;
            __assert_fail("0 && \"unexpected preshader operand type.\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                          ,0x77,
                          "void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
          }
          uVar3 = pMVar17->index;
          uVar9 = (ulong)uVar3;
          switch(pMVar17->type) {
          case MOJOSHADER_PRESHADEROPERAND_INPUT:
            if ((ulong)pMVar17->array_register_count == 0) {
              if (!bVar19 && !bVar20) {
                dStack_d8 = (double)pfVar4[uVar9];
                goto LAB_00126a86;
              }
              if (uVar12 != 0) {
                uVar9 = 0;
                do {
                  pdVar14[uVar9] = (double)pfVar4[uVar3 + (int)uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar12 != uVar9);
              }
            }
            else {
              fVar11 = *(float *)((long)pfVar4 + (ulong)(uVar3 & 0xfffffffc));
              uVar9 = 0;
              do {
                puVar1 = pMVar17->array_registers + uVar9;
                uVar9 = uVar9 + 1;
                fVar11 = pfVar4[(int)fVar11 + *puVar1];
              } while (pMVar17->array_register_count != uVar9);
              src[uVar18 - 1][3] = (double)(int)fVar11;
            }
            break;
          case MOJOSHADER_PRESHADEROPERAND_OUTPUT:
            if (bVar19 || bVar20) {
              if (uVar12 != 0) {
                uVar9 = 0;
                do {
                  pdVar14[uVar9] = (double)outregs[uVar3 + (int)uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar12 != uVar9);
              }
            }
            else {
              dStack_d8 = (double)outregs[uVar9];
LAB_00126a86:
            }
            break;
          case MOJOSHADER_PRESHADEROPERAND_LITERAL:
            if (bVar19 || bVar20) {
              if (preshader->literal_count < uVar3 + uVar8) {
                *(undefined8 *)(__s + -8) = 0x127400;
                __assert_fail("(index + elems) <= preshader->literal_count",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                              ,0x40,
                              "void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)")
                ;
              }
              pdVar5 = preshader->literals;
              *(undefined8 *)(__s + -8) = 0x126a30;
              memcpy(src[uVar18 - 1] + 3,pdVar5 + uVar9,sVar13);
              pMVar15 = local_e8;
              MVar16 = local_e0._0_4_;
            }
            else if (uVar12 != 0) {
              pdVar5 = preshader->literals;
              uVar10 = 0;
              do {
                src[-1][uVar10 + 3] = pdVar5[uVar9];
                uVar10 = uVar10 + 1;
              } while (uVar12 != uVar10);
            }
            break;
          case MOJOSHADER_PRESHADEROPERAND_TEMP:
            if (local_70 != (undefined1 *)0x0) {
              if (!bVar19 && !bVar20) {
                dStack_d8 = *(double *)(local_70 + uVar9 * 8);
                goto LAB_00126a86;
              }
              *(undefined8 *)(__s + -8) = 0x126ab6;
              memcpy(src[uVar18 - 1] + 3,local_70 + uVar9 * 8,sVar13);
              pMVar15 = local_e8;
              MVar16 = local_e0._0_4_;
            }
          }
          uVar18 = uVar18 + 1;
          pMVar17 = pMVar17 + 1;
          pdVar14 = pdVar14 + 4;
        } while (uVar18 < pMVar15->operand_count - 1);
      }
      switch(pMVar15->opcode) {
      case MOJOSHADER_PRESHADEROP_MOV:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          *(undefined8 *)(__s + -8) = 0x126b56;
          memcpy(&dStack_58,&dStack_d8,uVar18 << 3);
        }
        break;
      case MOJOSHADER_PRESHADEROP_NEG:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = -src[-1][uVar9 + 3];
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_RCP:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = 1.0 / src[-1][uVar9 + 3];
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_FRC:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            local_e0 = dVar23;
            *(undefined8 *)(__s + -8) = 0x12707b;
            dVar23 = floor(dVar23);
            dst[uVar9 - 1] = local_e0 - dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_EXP:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x126ebd;
            dVar23 = exp(dVar23);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_LOG:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x126fbf;
            dVar23 = log(dVar23);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_RSQ:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            if (dVar23 < 0.0) {
              *(undefined8 *)(__s + -8) = 0x127157;
              dVar23 = sqrt(dVar23);
            }
            else {
              dVar23 = SQRT(dVar23);
            }
            dst[uVar9 - 1] = 1.0 / dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_SIN:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x127037;
            dVar23 = sin(dVar23);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_COS:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x126d42;
            dVar23 = cos(dVar23);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ASIN:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x126c50;
            dVar23 = asin(dVar23);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ACOS:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x126d06;
            dVar23 = acos(dVar23);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ATAN:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x126bc3;
            dVar23 = atan(dVar23);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MIN:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            uVar21 = SUB84(dVar23,0);
            uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
            dVar2 = src[0][uVar9 + 3];
            if (dVar2 <= dVar23) {
              uVar21 = SUB84(dVar2,0);
              uVar22 = (undefined4)((ulong)dVar2 >> 0x20);
            }
            dst[uVar9 - 1] = (double)CONCAT44(uVar22,uVar21);
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MAX:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            uVar21 = SUB84(dVar23,0);
            uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
            dVar2 = src[0][uVar9 + 3];
            if (dVar23 <= dVar2) {
              uVar21 = SUB84(dVar2,0);
              uVar22 = (undefined4)((ulong)dVar2 >> 0x20);
            }
            dst[uVar9 - 1] = (double)CONCAT44(uVar22,uVar21);
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_LT:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] =
                 (double)((-(ulong)(src[-1][uVar9 + 3] < src[0][uVar9 + 3]) >> 0x20 & 0x3ff00000) <<
                         0x20);
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_GE:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] =
                 (double)((-(ulong)(src[0][uVar9 + 3] <= src[-1][uVar9 + 3]) >> 0x20 & 0x3ff00000)
                         << 0x20);
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ADD:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = src[-1][uVar9 + 3] + src[0][uVar9 + 3];
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MUL:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = src[-1][uVar9 + 3] * src[0][uVar9 + 3];
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ATAN2:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = src[-1][uVar9 + 3];
            dVar2 = src[0][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x1271a9;
            dVar23 = atan2(dVar23,dVar2);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_DIV:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = src[-1][uVar9 + 3] / src[0][uVar9 + 3];
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_CMP:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            padVar7 = src + 1;
            if (0.0 <= src[-1][uVar9 + 3]) {
              padVar7 = src;
            }
            dst[uVar9 - 1] = (*padVar7)[uVar9 + 3];
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      default:
        *(code **)(__s + -8) = MOJOSHADER_parseEffect;
        __assert_fail("0 && \"Unhandled preshader opcode!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0xb4,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)");
      case MOJOSHADER_PRESHADEROP_DOT:
        if (uVar12 == 0) {
          dVar23 = 0.0;
        }
        else {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          dVar23 = 0.0;
          uVar9 = 0;
          do {
            dVar23 = dVar23 + src[-1][uVar9 + 3] * src[0][uVar9 + 3];
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MIN_SCALAR:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = dStack_d8;
            if (src[0][uVar9 + 3] <= dStack_d8) {
              dVar23 = src[0][uVar9 + 3];
            }
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MAX_SCALAR:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar23 = dStack_d8;
            if (dStack_d8 <= src[0][uVar9 + 3]) {
              dVar23 = src[0][uVar9 + 3];
            }
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_LT_SCALAR:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = (double)(-(ulong)(dStack_d8 < src[0][uVar9 + 3]) & 0x3ff0000000000000);
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_GE_SCALAR:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = (double)(-(ulong)(src[0][uVar9 + 3] <= dStack_d8) & 0x3ff0000000000000)
            ;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ADD_SCALAR:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = src[0][uVar9 + 3] + dStack_d8;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_MUL_SCALAR:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = src[0][uVar9 + 3] * dStack_d8;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_ATAN2_SCALAR:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dVar2 = dStack_d8;
            dVar23 = src[0][uVar9 + 3];
            *(undefined8 *)(__s + -8) = 0x1270cb;
            dVar23 = atan2(dVar2,dVar23);
            dst[uVar9 - 1] = dVar23;
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
        break;
      case MOJOSHADER_PRESHADEROP_DIV_SCALAR:
        if (uVar12 != 0) {
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar9 = 0;
          do {
            dst[uVar9 - 1] = dStack_d8 / src[0][uVar9 + 3];
            uVar9 = uVar9 + 1;
          } while (uVar18 != uVar9);
        }
      }
      if (pMVar17->type == MOJOSHADER_PRESHADEROPERAND_TEMP) {
        uVar8 = pMVar17->index;
        sVar13 = (size_t)uStack_f0._4_4_;
        if ((ulong)preshader->temp_count < (sVar13 >> 3) + (ulong)uVar8) {
          *(undefined8 *)(__s + -8) = 0x12745d;
          __assert_fail("preshader->temp_count >= operand->index + (elemsbytes / sizeof (double))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0xbc,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)")
          ;
        }
        *(undefined8 *)(__s + -8) = 0x127386;
        memcpy(local_70 + (ulong)uVar8 * 8,&dStack_58,sVar13);
      }
      else {
        if (pMVar17->type != MOJOSHADER_PRESHADEROPERAND_OUTPUT) {
          *(undefined8 *)(__s + -8) = 0x12747c;
          __assert_fail("operand->type == MOJOSHADER_PRESHADEROPERAND_OUTPUT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0xc1,"void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *, float *)")
          ;
        }
        if (uVar12 != 0) {
          uVar3 = pMVar17->index;
          uVar18 = 1;
          if (1 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          uVar12 = 0;
          do {
            outregs[uVar3 + (int)uVar12] = (float)dst[uVar12 - 1];
            uVar12 = uVar12 + 1;
          } while (uVar18 != uVar12);
        }
      }
      uVar8 = (int)local_100 + 1;
      uVar18 = (ulong)uVar8;
      pMVar15 = local_e8 + 1;
    } while (uVar8 < preshader->instruction_count);
  }
  return;
}

Assistant:

void MOJOSHADER_runPreshader(const MOJOSHADER_preshader *preshader,
                             float *outregs)
{
    const float *inregs = preshader->registers;

    // this is fairly straightforward, as there aren't any branching
    //  opcodes in the preshader instruction set (at the moment, at least).
    const int scalarstart = (int) MOJOSHADER_PRESHADEROP_SCALAR_OPS;

    double *temps = NULL;
    if (preshader->temp_count > 0)
    {
        temps = (double *) alloca(sizeof (double) * preshader->temp_count);
        memset(temps, '\0', sizeof (double) * preshader->temp_count);
    } // if

    double dst[4] = { 0, 0, 0, 0 };
    double src[3][4] = { { 0, 0, 0, 0 }, { 0, 0, 0, 0 }, { 0, 0, 0, 0 } };
    const double *src0 = &src[0][0];
    const double *src1 = &src[1][0];
    const double *src2 = &src[2][0];

    MOJOSHADER_preshaderInstruction *inst = preshader->instructions;
    int instit;

    for (instit = 0; instit < preshader->instruction_count; instit++, inst++)
    {
        const MOJOSHADER_preshaderOperand *operand = inst->operands;
        const int elems = inst->element_count;
        const int elemsbytes = sizeof (double) * elems;
        const int isscalarop = (inst->opcode >= scalarstart);

        assert(elems >= 0);
        assert(elems <= 4);

        // load up our operands...
        int opiter, elemiter;
        for (opiter = 0; opiter < inst->operand_count-1; opiter++, operand++)
        {
            const int isscalar = ((isscalarop) && (opiter == 0));
            const unsigned int index = operand->index;
            switch (operand->type)
            {
                case MOJOSHADER_PRESHADEROPERAND_LITERAL:
                {
                    if (!isscalar)
                    {
                        assert((index + elems) <= preshader->literal_count);
                        memcpy(&src[opiter][0], &preshader->literals[index], elemsbytes);
                    } // if
                    else
                    {
                        for (elemiter = 0; elemiter < elems; elemiter++)
                            src[opiter][elemiter] = preshader->literals[index];
                    } // else
                    break;
                } // case

                case MOJOSHADER_PRESHADEROPERAND_INPUT:
                    if (operand->array_register_count > 0)
                    {
                        int i;
                        const int *regsi = (const int *) inregs;
                        int arrIndex = regsi[((index >> 4) * 4) + ((index >> 2) & 3)];
                        for (i = 0; i < operand->array_register_count; i++)
                        {
                            arrIndex = regsi[operand->array_registers[i] + arrIndex];
                        }
                        src[opiter][0] = arrIndex;
                    } // if
                    else if (isscalar)
                        src[opiter][0] = inregs[index];
                    else
                    {
                        int cpy;
                        for (cpy = 0; cpy < elems; cpy++)
                            src[opiter][cpy] = inregs[index+cpy];
                    } // else
                    break;

                case MOJOSHADER_PRESHADEROPERAND_OUTPUT:
                    if (isscalar)
                        src[opiter][0] = outregs[index];
                    else
                    {
                        int cpy;
                        for (cpy = 0; cpy < elems; cpy++)
                            src[opiter][cpy] = outregs[index+cpy];
                    } // else
                    break;

                case MOJOSHADER_PRESHADEROPERAND_TEMP:
                    if (temps != NULL)
                    {
                        if (isscalar)
                            src[opiter][0] = temps[index];
                        else
                            memcpy(src[opiter], temps + index, elemsbytes);
                    } // if
                    break;

                default:
                    assert(0 && "unexpected preshader operand type.");
                    return;
            } // switch
        } // for

        // run the actual instruction, store result to dst.
        int i;
        switch (inst->opcode)
        {
            #define OPCODE_CASE(op, val) \
                case MOJOSHADER_PRESHADEROP_##op: \
                    for (i = 0; i < elems; i++) { dst[i] = val; } \
                    break;

            //OPCODE_CASE(NOP, 0.0)  // not a real instruction.
            OPCODE_CASE(MOV, src0[i])
            OPCODE_CASE(NEG, -src0[i])
            OPCODE_CASE(RCP, 1.0 / src0[i])
            OPCODE_CASE(FRC, src0[i] - floor(src0[i]))
            OPCODE_CASE(EXP, exp(src0[i]))
            OPCODE_CASE(LOG, log(src0[i]))
            OPCODE_CASE(RSQ, 1.0 / sqrt(src0[i]))
            OPCODE_CASE(SIN, sin(src0[i]))
            OPCODE_CASE(COS, cos(src0[i]))
            OPCODE_CASE(ASIN, asin(src0[i]))
            OPCODE_CASE(ACOS, acos(src0[i]))
            OPCODE_CASE(ATAN, atan(src0[i]))
            OPCODE_CASE(MIN, (src0[i] < src1[i]) ? src0[i] : src1[i])
            OPCODE_CASE(MAX, (src0[i] > src1[i]) ? src0[i] : src1[i])
            OPCODE_CASE(LT, (src0[i] < src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(GE, (src0[i] >= src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(ADD, src0[i] + src1[i])
            OPCODE_CASE(MUL,  src0[i] * src1[i])
            OPCODE_CASE(ATAN2, atan2(src0[i], src1[i]))
            OPCODE_CASE(DIV, src0[i] / src1[i])
            OPCODE_CASE(CMP, (src0[i] >= 0.0) ? src1[i] : src2[i])
            //OPCODE_CASE(NOISE, ???)  // !!! FIXME: don't know what this does
            //OPCODE_CASE(MOVC, ???)  // !!! FIXME: don't know what this does
            OPCODE_CASE(MIN_SCALAR, (src0[0] < src1[i]) ? src0[0] : src1[i])
            OPCODE_CASE(MAX_SCALAR, (src0[0] > src1[i]) ? src0[0] : src1[i])
            OPCODE_CASE(LT_SCALAR, (src0[0] < src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(GE_SCALAR, (src0[0] >= src1[i]) ? 1.0 : 0.0)
            OPCODE_CASE(ADD_SCALAR, src0[0] + src1[i])
            OPCODE_CASE(MUL_SCALAR, src0[0] * src1[i])
            OPCODE_CASE(ATAN2_SCALAR, atan2(src0[0], src1[i]))
            OPCODE_CASE(DIV_SCALAR, src0[0] / src1[i])
            //OPCODE_CASE(DOT_SCALAR)  // !!! FIXME: isn't this just a MUL?
            //OPCODE_CASE(NOISE_SCALAR, ???)  // !!! FIXME: ?
            #undef OPCODE_CASE

            case MOJOSHADER_PRESHADEROP_DOT:
            {
                double final = 0.0;
                for (i = 0; i < elems; i++)
                    final += src0[i] * src1[i];
                for (i = 0; i < elems; i++)
                    dst[i] = final;  // !!! FIXME: is this right?
                break;
            } // case

            default:
                assert(0 && "Unhandled preshader opcode!");
                break;
        } // switch

        // Figure out where dst wants to be stored.
        if (operand->type == MOJOSHADER_PRESHADEROPERAND_TEMP)
        {
            assert(preshader->temp_count >=
                    operand->index + (elemsbytes / sizeof (double)));
            memcpy(temps + operand->index, dst, elemsbytes);
        } // if
        else
        {
            assert(operand->type == MOJOSHADER_PRESHADEROPERAND_OUTPUT);
            for (i = 0; i < elems; i++)
                outregs[operand->index + i] = (float) dst[i];
        } // else
    } // for
}